

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O1

void __thiscall Function::unvalidate(Function *this)

{
  do {
    this->bValueValid = false;
    if (this->xLeft != (Function *)0x0) {
      unvalidate(this->xLeft);
    }
    if (this->xRight != (Function *)0x0) {
      unvalidate(this->xRight);
    }
    this = this->xPlus;
  } while (this != (Function *)0x0);
  return;
}

Assistant:

void Function::unvalidate()
{
	// cout << " unvalidating {" << sName << endl;
	bValueValid = false;
	if (xLeft) xLeft->unvalidate();
	if (xRight) xRight->unvalidate();
	if (xPlus) xPlus->unvalidate();
	// cout << "} end unvaliding" << endl;
}